

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall gmath::PinholeCamera::getProperties(PinholeCamera *this,Properties *prop,int id)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_stack_000000d4;
  Properties *in_stack_000000d8;
  Camera *in_stack_000000e0;
  int in_stack_0000010c;
  char *in_stack_00000110;
  Camera *in_stack_00000118;
  SMatrix<double,_3,_3> *in_stack_00000120;
  char *in_stack_00000128;
  Properties *in_stack_00000130;
  string local_68 [48];
  string local_38 [36];
  undefined4 local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  Camera::getProperties(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
  Camera::getCameraKey_abi_cxx11_(in_stack_00000118,in_stack_00000110,in_stack_0000010c);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
            (in_stack_00000130,in_stack_00000128,in_stack_00000120);
  std::__cxx11::string::~string(local_38);
  Camera::getCameraKey_abi_cxx11_(in_stack_00000118,in_stack_00000110,in_stack_0000010c);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_00000130,in_stack_00000128,(double *)in_stack_00000120);
  std::__cxx11::string::~string(local_68);
  if (*(long *)(in_RDI + 0x110) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x110) + 0x40))(*(long **)(in_RDI + 0x110),local_10,local_14);
  }
  return;
}

Assistant:

void PinholeCamera::getProperties(gutil::Properties &prop, int id) const
{
  Camera::getProperties(prop, id);

  prop.putValue(getCameraKey("A", id).c_str(), A);
  prop.putValue(getCameraKey("rho", id).c_str(), rho);

  if (dist != 0)
  {
    dist->getProperties(prop, id);
  }
}